

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  cmGraphEdge local_48;
  ulong local_40;
  ulong local_38;
  
  uVar3 = ((long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>)
                 .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar4 = 0;
  local_40 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    local_40 = uVar4;
  }
  while (uVar4 != local_40) {
    iVar1 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = uVar4;
    for (pcVar5 = *(pointer *)&pcVar2[uVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>
        ; pcVar5 != *(pointer *)((long)(pcVar2 + uVar4) + 8); pcVar5 = pcVar5 + 1) {
      local_48.Dest =
           (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[pcVar5->Dest];
      if (iVar1 != local_48.Dest) {
        local_48.Strong = pcVar5->Strong;
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                  (&(this->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar1].
                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_48);
      }
    }
    uVar4 = local_38 + 1;
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].push_back(
          cmGraphEdge(j_component, ni->IsStrong()));
      }
    }
  }
}